

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>::dx
          (FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>,_Fad<double>_> *this,
          int i)

{
  double dVar1;
  double dVar2;
  Fad<double> *pFVar3;
  Fad<double> *pFVar4;
  double *pdVar5;
  double *pdVar6;
  
  pFVar3 = this->right_;
  pFVar4 = (this->left_->fadexpr_).right_;
  pdVar6 = &pFVar4->defaultVal;
  if ((pFVar4->dx_).num_elts != 0) {
    pdVar6 = (pFVar4->dx_).ptr_to_data + i;
  }
  dVar1 = (this->left_->fadexpr_).left_.constant_;
  dVar2 = pFVar4->val_;
  pdVar5 = &pFVar3->defaultVal;
  if ((pFVar3->dx_).num_elts != 0) {
    pdVar5 = (pFVar3->dx_).ptr_to_data + i;
  }
  return (dVar1 / dVar2) * *pdVar5 - ((*pdVar6 * dVar1) / (dVar2 * dVar2)) * pFVar3->val_;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}